

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O3

void __thiscall duckdb::ReservoirSample::SimpleMerge(ReservoirSample *this,ReservoirSample *other)

{
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *puVar1;
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> *this_01;
  sel_t *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  int iVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  idx_t iVar6;
  pointer pBVar7;
  idx_t iVar8;
  pointer pRVar9;
  ulong uVar10;
  DataChunk *this_;
  DataChunk *other_00;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  SelectionVector chunk_sel;
  SelectionVector local_70;
  ulong local_58;
  undefined8 uStack_50;
  double local_48;
  double dStack_40;
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *local_38;
  
  iVar6 = GetActiveSampleCount(other);
  if ((iVar6 != 0) ||
     (pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(&(other->super_BlockingSample).base_reservoir_sample),
     pBVar7->num_entries_seen_total != 0)) {
    iVar6 = GetActiveSampleCount(this);
    if (iVar6 == 0) {
      puVar1 = &(this->super_BlockingSample).base_reservoir_sample;
      pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(puVar1);
      if (pBVar7->num_entries_seen_total == 0) {
        local_70.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_70.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        shared_ptr<duckdb::SelectionData,_true>::operator=
                  (&local_70.selection_data,&(other->sel).selection_data);
        _Var5._M_pi = local_70.selection_data.internal.
                      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        peVar4 = local_70.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (this->sel).sel_vector = (other->sel).sel_vector;
        local_70.sel_vector = (sel_t *)0x0;
        local_70.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_70.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_02 = (this->sel).selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (this->sel).selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
        (this->sel).selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var5._M_pi;
        if ((this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02),
           local_70.selection_data.internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        this->sel_size = other->sel_size;
        pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                 ::operator->(&(other->super_BlockingSample).base_reservoir_sample);
        iVar6 = pBVar7->num_entries_seen_total;
        pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                 ::operator->(puVar1);
        pBVar7->num_entries_seen_total = iVar6;
        return;
      }
    }
    puVar1 = &(this->super_BlockingSample).base_reservoir_sample;
    pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(puVar1);
    iVar6 = pBVar7->num_entries_seen_total;
    this_00 = &(other->super_BlockingSample).base_reservoir_sample;
    pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    lVar11 = iVar6 + pBVar7->num_entries_seen_total;
    pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(puVar1);
    auVar20._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar20._0_8_ = lVar11;
    auVar20._12_4_ = 0x45300000;
    dVar15 = (double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0;
    local_48 = auVar20._8_8_ - 1.9342813113834067e+25;
    local_58 = pBVar7->num_entries_seen_total;
    uStack_50 = 0;
    dStack_40 = local_48;
    local_38 = this_00;
    pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    auVar19._0_8_ =
         ((double)(local_58 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(local_58 & 0xffffffff | 0x4330000000000000);
    auVar19._8_8_ =
         ((double)(pBVar7->num_entries_seen_total >> 0x20 | 0x4530000000000000) -
         1.9342813118337666e+25) +
         (double)(pBVar7->num_entries_seen_total & 0xffffffff | 0x4330000000000000);
    auVar16._0_8_ = dVar15 + local_48;
    auVar16._8_8_ = dVar15 + dStack_40;
    auVar20 = divpd(auVar19,auVar16);
    dVar15 = auVar20._8_8_;
    dVar18 = auVar20._0_8_;
    uVar14 = -(ulong)(dVar18 + dVar15 < 1.0);
    dVar15 = (double)(~uVar14 & (ulong)dVar15 | (ulong)((1.0 - (dVar18 + dVar15)) + dVar15) & uVar14
                     );
    auVar21._0_8_ = (double)CONCAT44(0x43300000,(int)this->sample_count);
    auVar21._8_4_ = (int)(this->sample_count >> 0x20);
    auVar21._12_4_ = 0x45300000;
    dVar17 = (auVar21._8_8_ - 1.9342813113834067e+25) + (auVar21._0_8_ - 4503599627370496.0);
    if (dVar18 <= dVar15) {
      dVar15 = round(dVar15 * dVar17);
      iVar6 = (long)(dVar15 - 9.223372036854776e+18) & (long)dVar15 >> 0x3f | (long)dVar15;
      iVar8 = GetActiveSampleCount(other);
      if (iVar8 <= iVar6) {
        iVar6 = iVar8;
      }
      uVar14 = this->sample_count - iVar6;
      iVar8 = GetActiveSampleCount(this);
      if (iVar8 <= uVar14) {
        uVar14 = iVar8;
      }
    }
    else {
      dVar15 = round(dVar18 * dVar17);
      uVar14 = (long)(dVar15 - 9.223372036854776e+18) & (long)dVar15 >> 0x3f | (long)dVar15;
      iVar6 = GetActiveSampleCount(this);
      if (iVar6 <= uVar14) {
        uVar14 = iVar6;
      }
      iVar6 = this->sample_count - uVar14;
      iVar8 = GetActiveSampleCount(other);
      if (iVar8 <= iVar6) {
        iVar6 = iVar8;
      }
    }
    uVar13 = uVar14 + iVar6;
    if (0x7ff < uVar13) {
      uVar13 = 0x800;
    }
    this_01 = &this->reservoir_chunk;
    pRVar9 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(this_01);
    uVar12 = this->sample_count;
    uVar10 = 0x800;
    if (uVar12 < 0x800) {
      uVar10 = uVar12;
    }
    if (uVar12 + (uVar10 * 5 & 0xffffffff) * 2 < (pRVar9->chunk).count + iVar6) {
      Vacuum(this);
    }
    local_58 = iVar6;
    SelectionVector::SelectionVector(&local_70,iVar6);
    pRVar9 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(this_01);
    if (uVar14 < uVar13) {
      iVar6 = (pRVar9->chunk).count;
      local_48 = (double)(uVar14 * 4);
      uVar12 = 0;
      do {
        iVar8 = GetActiveSampleCount(this);
        iVar3 = (int)iVar6;
        if (uVar14 + uVar12 < iVar8) {
          *(int *)((long)(this->sel).sel_vector + uVar12 * 4 + (long)local_48) = (int)uVar12 + iVar3
          ;
        }
        else {
          iVar8 = GetActiveSampleCount(this);
          (this->sel).sel_vector[iVar8] = (int)uVar12 + iVar3;
          this->sel_size = this->sel_size + 1;
        }
        psVar2 = (other->sel).sel_vector;
        uVar10 = uVar12;
        if (psVar2 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar2[uVar12];
        }
        local_70.sel_vector[uVar12] = (sel_t)uVar10;
        uVar12 = uVar12 + 1;
      } while (uVar13 - uVar14 != uVar12);
    }
    this_ = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(this_01)->chunk;
    other_00 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                ::operator->(&other->reservoir_chunk)->chunk;
    UpdateSampleAppend(this,this_,other_00,&local_70,local_58);
    pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(local_38);
    iVar6 = pBVar7->num_entries_seen_total;
    pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(puVar1);
    pBVar7->num_entries_seen_total = pBVar7->num_entries_seen_total + iVar6;
    pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(puVar1);
    if (0x1dfff < pBVar7->num_entries_seen_total) {
      pBVar7 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
               ::operator->(puVar1);
      BaseReservoirSampling::FillWeights(pBVar7,(SelectionVector *)this_,&this->sel_size);
    }
    if (local_70.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return;
}

Assistant:

void ReservoirSample::SimpleMerge(ReservoirSample &other) {
	D_ASSERT(GetPriorityQueueSize() == 0);
	D_ASSERT(other.GetPriorityQueueSize() == 0);
	D_ASSERT(GetSamplingState() == SamplingState::RANDOM);
	D_ASSERT(other.GetSamplingState() == SamplingState::RANDOM);

	if (other.GetActiveSampleCount() == 0 && other.GetTuplesSeen() == 0) {
		return;
	}

	if (GetActiveSampleCount() == 0 && GetTuplesSeen() == 0) {
		sel = SelectionVector(other.sel);
		sel_size = other.sel_size;
		base_reservoir_sample->num_entries_seen_total = other.GetTuplesSeen();
		return;
	}

	idx_t total_seen = GetTuplesSeen() + other.GetTuplesSeen();

	auto weight_tuples_this = static_cast<double>(GetTuplesSeen()) / static_cast<double>(total_seen);
	auto weight_tuples_other = static_cast<double>(other.GetTuplesSeen()) / static_cast<double>(total_seen);

	// If weights don't add up to 1, most likely a simple merge occured and no new samples were added.
	// if that is the case, add the missing weight to the lower weighted sample to adjust.
	// this is to avoid cases where if you have a 20k row table and add another 20k rows row by row
	// then eventually the missing weights will add up, and get you a more even distribution
	if (weight_tuples_this + weight_tuples_other < 1) {
		weight_tuples_other += 1 - (weight_tuples_other + weight_tuples_this);
	}

	idx_t keep_from_this = 0;
	idx_t keep_from_other = 0;
	D_ASSERT(stats_sample);
	D_ASSERT(sample_count == FIXED_SAMPLE_SIZE);
	D_ASSERT(sample_count == other.sample_count);
	auto sample_count_double = static_cast<double>(sample_count);

	if (weight_tuples_this > weight_tuples_other) {
		keep_from_this = MinValue<idx_t>(static_cast<idx_t>(round(sample_count_double * weight_tuples_this)),
		                                 GetActiveSampleCount());
		keep_from_other = MinValue<idx_t>(sample_count - keep_from_this, other.GetActiveSampleCount());
	} else {
		keep_from_other = MinValue<idx_t>(static_cast<idx_t>(round(sample_count_double * weight_tuples_other)),
		                                  other.GetActiveSampleCount());
		keep_from_this = MinValue<idx_t>(sample_count - keep_from_other, GetActiveSampleCount());
	}

	D_ASSERT(keep_from_this <= GetActiveSampleCount());
	D_ASSERT(keep_from_other <= other.GetActiveSampleCount());
	D_ASSERT(keep_from_other + keep_from_this <= FIXED_SAMPLE_SIZE);
	idx_t size_after_merge = MinValue<idx_t>(keep_from_other + keep_from_this, FIXED_SAMPLE_SIZE);

	// Check if appending the other samples to this will go over the sample chunk size
	if (reservoir_chunk->chunk.size() + keep_from_other > GetReservoirChunkCapacity<idx_t>()) {
		Vacuum();
	}

	D_ASSERT(size_after_merge <= other.GetActiveSampleCount() + GetActiveSampleCount());
	SelectionVector chunk_sel(keep_from_other);
	auto offset = reservoir_chunk->chunk.size();
	for (idx_t i = keep_from_this; i < size_after_merge; i++) {
		if (i >= GetActiveSampleCount()) {
			D_ASSERT(sel_size >= GetActiveSampleCount());
			sel.set_index(GetActiveSampleCount(), offset);
			sel_size += 1;
		} else {
			sel.set_index(i, offset);
		}
		chunk_sel.set_index(i - keep_from_this, other.sel.get_index(i - keep_from_this));
		offset += 1;
	}

	D_ASSERT(GetActiveSampleCount() == size_after_merge);

	// Copy the rows that make it to the sample from other and put them into this.
	UpdateSampleAppend(reservoir_chunk->chunk, other.reservoir_chunk->chunk, chunk_sel, keep_from_other);
	base_reservoir_sample->num_entries_seen_total += other.GetTuplesSeen();

	// if THIS has too many samples now, we conver it to a slower sample.
	if (GetTuplesSeen() >= FIXED_SAMPLE_SIZE * FAST_TO_SLOW_THRESHOLD) {
		ConvertToReservoirSample();
	}
	Verify();
}